

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hh
# Opt level: O1

const_iterator_t * __thiscall
tchecker::
collision_table_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t>
::end(const_iterator_t *__return_storage_ptr__,
     collision_table_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t>
     *this)

{
  function<_8f055410_> local_38;
  end_iterator_t local_18;
  begin_iterator_t local_10;
  
  local_18._M_current =
       (this->_table).
       super__Vector_base<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>,_std::allocator<std::vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.super__Function_base._M_functor._8_8_ = 0;
  local_38.super__Function_base._M_functor._M_unused._M_object = extract_collision_list_const_range;
  local_38._M_invoker = std::_Function_handler<$2edfd26f$>::_M_invoke;
  local_38.super__Function_base._M_manager = std::_Function_handler<$2edfd26f$>::_M_manager;
  local_10._M_current = local_18._M_current;
  join_iterator_t<$3628a9be$>::join_iterator_t(__return_storage_ptr__,&local_10,&local_18,&local_38)
  ;
  if (local_38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.super__Function_base._M_manager)
              ((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::collision_table_t<SPTR, HASH>::const_iterator_t end() const
  {
    return tchecker::collision_table_t<SPTR, HASH>::const_iterator_t(
        _table.end(), _table.end(), tchecker::collision_table_t<SPTR, HASH>::extract_collision_list_const_range);
  }